

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec2 djb::ggx::u2_to_md2(vec2 *u,float_t zi)

{
  float_t fVar1;
  float fVar2;
  float_t fVar3;
  float_t fVar4;
  double dVar5;
  double dVar6;
  vec2 local_44;
  float local_3c;
  float local_38;
  float_t phi_1;
  float_t uy_1;
  float local_2c;
  float local_28;
  float_t phi;
  float_t uy;
  float_t nrm;
  float_t a;
  float_t zi_local;
  vec2 *u_local;
  
  uy = 1.0 / (zi + 1.0);
  nrm = zi;
  _a = u;
  dVar5 = std::sqrt((double)(ulong)(uint)u->x);
  phi = SUB84(dVar5,0);
  if (_a->y <= uy) {
    fVar2 = _a->y / uy;
    local_38 = fVar2;
    fVar3 = m_pi();
    fVar1 = phi;
    local_3c = fVar2 * fVar3;
    dVar5 = std::sin((double)(ulong)(uint)local_3c);
    dVar6 = std::cos((double)(ulong)(uint)local_3c);
    vec2::vec2(&local_44,-SUB84(dVar5,0),SUB84(dVar6,0));
    u_local = (vec2 *)djb::operator*(fVar1,&local_44);
  }
  else {
    fVar2 = (_a->y - uy) / (1.0 - uy);
    local_28 = fVar2;
    fVar3 = m_pi();
    fVar4 = m_pi();
    fVar1 = phi;
    local_2c = fVar2 * fVar3 + fVar4;
    dVar5 = std::sin((double)(ulong)(uint)local_2c);
    fVar2 = -SUB84(dVar5,0) * nrm;
    dVar5 = std::cos((double)(ulong)(uint)local_2c);
    vec2::vec2((vec2 *)&phi_1,fVar2,SUB84(dVar5,0));
    u_local = (vec2 *)djb::operator*(fVar1,(vec2 *)&phi_1);
  }
  return (vec2)u_local;
}

Assistant:

vec2 ggx::u2_to_md2(const vec2& u, float_t zi)
{
	float_t a = 1 / (1 + zi);

#if 0
	if (u.x > a) {
		float_t xu = (u.x - a) / (1 - a); // remap to [0, 1]

		return vec2(zi, 1) * u2_to_hd2(vec2(xu, u.y));
	} else {
		float_t xu = (u.x - a) / a; // remap to [-1, 0]

		return u2_to_hd2(vec2(xu, u.y));
	}
#else
	float_t nrm = sqrt(u.x);

	if (u.y > a) {
		float_t uy = (u.y - a) / (1 - a); // remap to [0, 1]
		float_t phi = uy * m_pi() + m_pi();

		return nrm * vec2(-sin(phi) * zi, cos(phi));
	} else {
		float_t uy = u.y / a; // remap to [0, 1]
		float_t phi = uy * m_pi();

		return nrm * vec2(-sin(phi), cos(phi));
	}
#endif
}